

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::move(QWidget *this,QPoint *p)

{
  Representation *pRVar1;
  ushort *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidgetPrivate *this_00;
  QWExtra *pQVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  QWidgetData *pQVar12;
  QWidgetPrivate *d;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  uVar9 = this_00->high_attributes[0];
  if ((uVar9 >> 0xb & 1) == 0) {
    uVar9 = uVar9 | 0x800;
    this_00->high_attributes[0] = uVar9;
  }
  pQVar12 = this->data;
  uVar3 = (pQVar12->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((uVar9 >> 0x1c & 1) == 0) {
    if ((uVar3 & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      puVar2 = (ushort *)
               ((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
      *puVar2 = *puVar2 | 0x100;
      pQVar12 = this->data;
    }
    iVar4 = (p->xp).m_i;
    pRVar1 = &(pQVar12->crect).x2;
    pRVar1->m_i = pRVar1->m_i + (iVar4 - (pQVar12->crect).x1.m_i);
    (pQVar12->crect).x1.m_i = iVar4;
    iVar4 = (p->yp).m_i;
    pRVar1 = &(pQVar12->crect).y2;
    pRVar1->m_i = pRVar1->m_i + (iVar4 - (pQVar12->crect).y1.m_i);
    (pQVar12->crect).y1.m_i = iVar4;
    uVar9 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
    if ((uVar9 & 4) == 0) {
      *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar9 | 4;
    }
  }
  else {
    if ((uVar3 & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      puVar2 = (ushort *)
               ((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
      *puVar2 = *puVar2 & 0xfeff;
      pQVar12 = this->data;
    }
    iVar4 = (pQVar12->crect).x1.m_i;
    iVar5 = (p->xp).m_i;
    iVar10 = x(this);
    iVar6 = (this->data->crect).y1.m_i;
    iVar7 = (p->yp).m_i;
    iVar11 = y(this);
    pQVar12 = this->data;
    QWidgetPrivate::setGeometry_sys
              (this_00,(iVar4 + iVar5) - iVar10,(iVar6 + iVar7) - iVar11,
               ((pQVar12->crect).x2.m_i - (pQVar12->crect).x1.m_i) + 1,
               ((pQVar12->crect).y2.m_i - (pQVar12->crect).y1.m_i) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar8 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar8 != (QWExtra *)0x0) && ((pQVar8->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
    return;
  }
  return;
}

Assistant:

void QWidget::move(const QPoint &p)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Moved);
    if (testAttribute(Qt::WA_WState_Created)) {
        if (isWindow())
            d->topData()->posIncludesFrame = false;
        d->setGeometry_sys(p.x() + geometry().x() - QWidget::x(),
                       p.y() + geometry().y() - QWidget::y(),
                       width(), height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        // no frame yet: see also QWidgetPrivate::fixPosIncludesFrame(), QWindowPrivate::PositionPolicy.
        if (isWindow())
            d->topData()->posIncludesFrame = true;
        data->crect.moveTopLeft(p); // no frame yet
        setAttribute(Qt::WA_PendingMoveEvent);
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}